

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::InitOwnOptions(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *this)

{
  CStringRef arg0;
  long in_RDI;
  SolverOptionManager *this_00;
  int *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar2;
  OptionValueInfo *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  SolverOptionManager *in_stack_ffffffffffffffc0;
  ValueArrayRef in_stack_ffffffffffffffc8;
  string local_28 [40];
  
  this_00 = (SolverOptionManager *)(in_RDI + 0x48);
  EnvKeeper::GetEnv((EnvKeeper *)this_00);
  uVar2 = 0;
  uVar1 = 1;
  SolverOptionManager::AddOption<int>
            (this_00,(char *)CONCAT44(1,in_stack_ffffffffffffff78),in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68,0,0x672373);
  EnvKeeper::GetEnv((EnvKeeper *)this_00);
  SolverOptionManager::AddOption<int>
            (this_00,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff78),in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68,0,0x6723ad);
  EnvKeeper::GetEnv((EnvKeeper *)this_00);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)&stack0xffffffffffffffd0,
             "Product preprocessing flags. Sum of a subset of the following bits:\n\n| 1 - Quadratize higher-order products in the       following order: integer terms first,       then real-valued ones; in each group,       smaller-range terms first.\n| 2 - Logicalize products of 2 binary terms. Logicalizing       means that the product is converted to a conjunction.       If the solver does not support it natively (see acc:and),       the conjunction is linearized.\n| 4 - Logicalize products of >=3 binary terms.\n\nDefault: {}.\n\nBits 2 or 4 imply bit 1."
            );
  arg0.data_._4_4_ = uVar2;
  arg0.data_._0_4_ = in_stack_ffffffffffffffa8;
  fmt::format<int>(arg0,(int *)(in_RDI + 0x94));
  std::__cxx11::string::c_str();
  SolverOptionManager::AddOption<int>
            (this_00,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff78),in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68,0,0x672424);
  std::__cxx11::string::~string(local_28);
  EnvKeeper::GetEnv((EnvKeeper *)(in_RDI + 0x48));
  ValueArrayRef::ValueArrayRef<3>((ValueArrayRef *)&stack0xffffffffffffffb0,&values_dvelim,0);
  SolverOptionManager::AddStoredOption<int>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
             (int *)CONCAT44(uVar2,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void InitOwnOptions() {
    GetEnv().AddOption("cvt:sos sos",
        "0/1*: Whether to honor declared suffixes .sosno and .ref describing "
        "SOS sets. Each distinct nonzero .sosno "
        "value designates an SOS set, of type 1 for "
        "positive .sosno values and of type 2 for "
        "negative values.  The .ref suffix contains "
        "corresponding reference values used to order the variables.",
        options_.sos_, 0, 1);
    GetEnv().AddOption("cvt:sos2 sos2",
        "0*/1: Whether to honor SOS2 constraints for nonconvex "
        "piecewise-linear terms, using suffixes .sos and .sosref "
        "provided by AMPL. Currently under rework.",
        options_.sos2_, 0, 1);
    GetEnv().AddOption("cvt:prod cvt:pre:prod",
                       fmt::format("Product preprocessing flags. "
                       "Sum of a subset of the following bits:\n"
                       "\n"
                       "| 1 - Quadratize higher-order products in the "
                       "      following order: integer terms first, "
                       "      then real-valued ones; in each group, "
                       "      smaller-range terms first.\n"
                       "| 2 - Logicalize products of 2 binary terms. Logicalizing "
                       "      means that the product is converted to a conjunction. "
                       "      If the solver does not support it natively (see acc:and), "
                       "      the conjunction is linearized.\n"
                       "| 4 - Logicalize products of >=3 binary terms.\n"
                       "\n"
                       "Default: {}.\n"
                       "\n"
                                   "Bits 2 or 4 imply bit 1.", prepro_products_).c_str(),
                       prepro_products_, 0, 1023);
    GetEnv().AddStoredOption("cvt:dvelim dvelim",
                       "Eliminate AMPL defined variables "
                       "by substitution into linear, quadratic, and polynomial "
                       "expressions:\n"
                       "\n.. value-table::\n"
                             "\nSee also AMPL options linelim and substout.",
                       dvelim_, values_dvelim);
  }